

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::processExecRequest(CommonCore *this,ActionMessage *cmd)

{
  int iVar1;
  pointer ppVar2;
  BaseTimeCoordinator *pBVar3;
  string_view message;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  mapped_type *this_00;
  pair<helics::GlobalFederateId,_int> *block;
  pointer ppVar7;
  GlobalFederateId *dep;
  pointer pGVar8;
  string_view name;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> local_48;
  undefined8 local_30;
  char *pcStack_28;
  
  bVar5 = isLocal(this,(GlobalFederateId)(cmd->source_id).gid);
  if (bVar5) {
    ppVar7 = (this->timeBlocks).
             super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->timeBlocks).
             super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar7 != ppVar2) {
      iVar6 = (cmd->source_id).gid;
      do {
        if ((ppVar7->first).gid == iVar6) {
          if (ppVar7->second != 0) {
            local_48.
            super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
            _M_impl.super__Vector_impl_data._M_start._0_4_ = iVar6;
            this_00 = std::
                      map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                      ::operator[](&this->delayedTimingMessages,(key_type *)&local_48);
            std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                      (this_00,cmd);
            return;
          }
          break;
        }
        ppVar7 = ppVar7 + 1;
      } while (ppVar7 != ppVar2);
    }
  }
  iVar6 = (this->super_BrokerBase).global_broker_id_local.gid;
  iVar1 = (cmd->dest_id).gid;
  if (iVar1 == iVar6) {
    pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    (*pBVar3->_vptr_BaseTimeCoordinator[3])(pBVar3,cmd);
    if ((this->super_BrokerBase).enteredExecutionMode == false) {
      pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      iVar6 = (*pBVar3->_vptr_BaseTimeCoordinator[9])(pBVar3,0x8831d580);
      if ((char)iVar6 != '\0') {
        (*((this->super_BrokerBase).timeCoord._M_t.
           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
          _vptr_BaseTimeCoordinator[2])();
        return;
      }
      (this->super_BrokerBase).enteredExecutionMode = true;
      if (0xe < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        local_30 = 0x12;
        pcStack_28 = "entering Exec Mode";
        message._M_str = "entering Exec Mode";
        message._M_len = 0x12;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (&this->super_BrokerBase,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,0xf,name,
                   message,false);
      }
    }
  }
  else {
    if (((iVar1 != -1700000000) && (iVar1 != -2010000000)) || ((cmd->source_id).gid != iVar6)) {
      routeMessage(this,cmd);
      return;
    }
    BaseTimeCoordinator::getDependents
              (&local_48,
               (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    for (pGVar8 = (pointer)CONCAT44(local_48.
                                    super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)local_48.
                                         super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
        pGVar8 != local_48.
                  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pGVar8 = pGVar8 + 1) {
      routeMessage(this,cmd,(GlobalFederateId)pGVar8->gid);
    }
    pvVar4 = (void *)CONCAT44(local_48.
                              super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_48.
                                   super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_48.
                                   super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4
                     );
    }
  }
  return;
}

Assistant:

void CommonCore::processExecRequest(ActionMessage& cmd)
{
    if (isLocal(GlobalBrokerId{cmd.source_id})) {
        if (hasTimeBlock(cmd.source_id)) {
            delayedTimingMessages[cmd.source_id.baseValue()].push_back(cmd);
            return;
        }
    }
    if (cmd.dest_id == global_broker_id_local) {
        timeCoord->processTimeMessage(cmd);
        if (!enteredExecutionMode) {
            auto res = timeCoord->checkExecEntry();
            if (res == MessageProcessingResult::NEXT_STEP) {
                enteredExecutionMode = true;
                LOG_TIMING(global_broker_id_local, getIdentifier(), "entering Exec Mode");
            } else {
                timeCoord->updateTimeFactors();
            }
        }
    } else if (!cmd.dest_id.isValid() && cmd.source_id == global_broker_id_local) {
        for (auto& dep : timeCoord->getDependents()) {
            routeMessage(cmd, dep);
        }
    } else {
        routeMessage(cmd);
    }
}